

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Expression> __thiscall Parser::postfix(Parser *this,ptr<Expression> *callee)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  ptr<Expression> pVar4;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> _Stack_58;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar2 = match((Parser *)callee,LeftParen);
  if (bVar2) {
    std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_38,in_RDX);
    call(this,callee);
    this_00 = &local_38._M_refcount;
  }
  else {
    bVar2 = match((Parser *)callee,LeftBrack);
    if (bVar2) {
      std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_48,in_RDX);
      access(this,(char *)callee,(int)&local_48);
      this_00 = &local_48._M_refcount;
    }
    else {
      bVar2 = match((Parser *)callee,Dot);
      if (!bVar2) {
        p_Var1 = (in_RDX->_M_refcount)._M_pi;
        (in_RDX->_M_refcount)._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (this->filepath)._M_dataplus._M_p = (pointer)in_RDX->_M_ptr;
        (this->filepath)._M_string_length = (size_type)p_Var1;
        in_RDX->_M_ptr = (element_type *)0x0;
        _Var3._M_pi = extraout_RDX;
        goto LAB_0010e2b2;
      }
      std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&_Stack_58,in_RDX);
      memberAccess(this,callee);
      this_00 = &_Stack_58._M_refcount;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  _Var3._M_pi = extraout_RDX_00;
LAB_0010e2b2:
  pVar4.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  pVar4.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar4.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::postfix(ptr<Expression> callee) {
    if(match(TokenType::LeftParen)) {
        return call(callee);
    } else if(match(TokenType::LeftBrack)) {
        return access(callee);
    } else if(match(TokenType::Dot)) {
        return memberAccess(callee);
    }
    return callee;
}